

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetacontainer.cpp
# Opt level: O3

void * __thiscall QMetaContainer::begin(QMetaContainer *this,void *container)

{
  CreateIteratorFn UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  if ((this->d_ptr != (QMetaContainerInterface *)0x0) &&
     (UNRECOVERED_JUMPTABLE = this->d_ptr->createIteratorFn,
     UNRECOVERED_JUMPTABLE != (CreateIteratorFn)0x0)) {
    pvVar1 = (*UNRECOVERED_JUMPTABLE)(container,AtBegin);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

bool QMetaContainer::hasIterator() const
{
    if (!d_ptr || !d_ptr->createIteratorFn)
        return false;
    Q_ASSERT(d_ptr->destroyIteratorFn);
    Q_ASSERT(d_ptr->compareIteratorFn);
    Q_ASSERT(d_ptr->copyIteratorFn);
    Q_ASSERT(d_ptr->advanceIteratorFn);
    Q_ASSERT(d_ptr->diffIteratorFn);
    return true;
}